

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t archive_read_format_tar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  long lVar2;
  size_t in_RAX;
  void *pvVar3;
  int64_t iVar4;
  undefined8 *__ptr;
  ssize_t bytes_read;
  size_t local_38;
  
  pvVar1 = a->format->data;
  __ptr = *(undefined8 **)((long)pvVar1 + 0xe0);
  local_38 = in_RAX;
LAB_001368bb:
  do {
    if (__ptr == (undefined8 *)0x0) {
      __ptr = (undefined8 *)0x0;
    }
    else if (__ptr[2] == 0) {
      *(undefined8 *)((long)pvVar1 + 0xe0) = *__ptr;
      free(__ptr);
      __ptr = *(undefined8 **)((long)pvVar1 + 0xe0);
      goto LAB_001368bb;
    }
    if (*(long *)((long)pvVar1 + 0xb0) != 0) {
      __archive_read_consume(a,*(long *)((long)pvVar1 + 0xb0));
      *(undefined8 *)((long)pvVar1 + 0xb0) = 0;
      __ptr = *(undefined8 **)((long)pvVar1 + 0xe0);
    }
    if ((__ptr == (undefined8 *)0x0) || (*(long *)((long)pvVar1 + 0x98) == 0)) {
      iVar4 = __archive_read_consume(a,*(int64_t *)((long)pvVar1 + 0xa8));
      if (iVar4 < 0) {
        return L'\xffffffe2';
      }
      *(undefined8 *)((long)pvVar1 + 0xa8) = 0;
      *buff = (void *)0x0;
      *size = 0;
      *offset = *(int64_t *)((long)pvVar1 + 0xb8);
      return L'\x01';
    }
    pvVar3 = __archive_read_ahead(a,1,(ssize_t *)&local_38);
    *buff = pvVar3;
    if (pvVar3 == (void *)0x0) {
      archive_set_error(&a->archive,-1,"Truncated tar archive detected while reading data");
      return L'\xffffffe2';
    }
    if ((long)*(size_t *)((long)pvVar1 + 0x98) < (long)local_38) {
      local_38 = *(size_t *)((long)pvVar1 + 0x98);
    }
    __ptr = *(undefined8 **)((long)pvVar1 + 0xe0);
    if ((long)__ptr[2] < (long)local_38) {
      local_38 = __ptr[2];
    }
    *size = local_38;
    lVar2 = __ptr[1];
    *offset = lVar2;
    __ptr[2] = __ptr[2] - local_38;
    __ptr[1] = lVar2 + local_38;
    *(long *)((long)pvVar1 + 0x98) = *(long *)((long)pvVar1 + 0x98) - local_38;
    *(size_t *)((long)pvVar1 + 0xb0) = local_38;
    if (*(int *)(__ptr + 3) == 0) {
      return L'\0';
    }
  } while( true );
}

Assistant:

static int
archive_read_format_tar_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct tar *tar;
	struct sparse_block *p;

	tar = (struct tar *)(a->format->data);

	for (;;) {
		/* Remove exhausted entries from sparse list. */
		while (tar->sparse_list != NULL &&
		    tar->sparse_list->remaining == 0) {
			p = tar->sparse_list;
			tar->sparse_list = p->next;
			free(p);
		}

		if (tar->entry_bytes_unconsumed) {
			__archive_read_consume(a, tar->entry_bytes_unconsumed);
			tar->entry_bytes_unconsumed = 0;
		}

		/* If we're at end of file, return EOF. */
		if (tar->sparse_list == NULL ||
		    tar->entry_bytes_remaining == 0) {
			if (__archive_read_consume(a, tar->entry_padding) < 0)
				return (ARCHIVE_FATAL);
			tar->entry_padding = 0;
			*buff = NULL;
			*size = 0;
			*offset = tar->disk_size;
			return (ARCHIVE_EOF);
		}

		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (*buff == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated tar archive"
			    " detected while reading data");
			return (ARCHIVE_FATAL);
		}
		if (bytes_read > tar->entry_bytes_remaining)
			bytes_read = (ssize_t)tar->entry_bytes_remaining;
		/* Don't read more than is available in the
		 * current sparse block. */
		if (tar->sparse_list->remaining < bytes_read)
			bytes_read = (ssize_t)tar->sparse_list->remaining;
		*size = bytes_read;
		*offset = tar->sparse_list->offset;
		tar->sparse_list->remaining -= bytes_read;
		tar->sparse_list->offset += bytes_read;
		tar->entry_bytes_remaining -= bytes_read;
		tar->entry_bytes_unconsumed = bytes_read;

		if (!tar->sparse_list->hole)
			return (ARCHIVE_OK);
		/* Current is hole data and skip this. */
	}
}